

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_test.cc
# Opt level: O0

void re2::SetPrefix(void)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  LogMessage local_1480;
  LogMessage local_1300;
  LogMessage local_1180;
  StringPiece local_1000;
  LogMessage local_ff0;
  LogMessage local_e70;
  LogMessage local_cf0;
  StringPiece local_b70;
  LogMessage local_b60;
  LogMessage local_9e0;
  StringPiece local_860;
  undefined1 local_850 [8];
  vector<int,_std::allocator<int>_> v;
  StringPiece local_6b8;
  LogMessage local_6a8;
  StringPiece local_528;
  LogMessage local_518;
  StringPiece local_398;
  LogMessage local_388;
  LogMessage local_208;
  StringPiece local_78;
  Options local_68;
  undefined1 local_50 [8];
  Set s;
  
  RE2::Options::Options(&local_68,DefaultOptions);
  RE2::Set::Set((Set *)local_50,&local_68,ANCHOR_BOTH);
  StringPiece::StringPiece(&local_78,"/prefix/\\d*");
  iVar2 = RE2::Set::Add((Set *)local_50,&local_78,(string *)0x0);
  if (iVar2 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x9c);
    poVar5 = LogMessage::stream(&local_208);
    std::operator<<(poVar5,"Check failed: (s.Add(\"/prefix/\\\\d*\", __null)) == (0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_208);
  }
  bVar1 = RE2::Set::Compile((Set *)local_50);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_388,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x9d);
    poVar5 = LogMessage::stream(&local_388);
    std::operator<<(poVar5,"Check failed: (s.Compile()) == (true)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_388);
  }
  StringPiece::StringPiece(&local_398,"/prefix");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_398,(vector<int,_std::allocator<int>_> *)0x0);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_518,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x9f);
    poVar5 = LogMessage::stream(&local_518);
    std::operator<<(poVar5,"Check failed: (s.Match(\"/prefix\", __null)) == (false)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_518);
  }
  StringPiece::StringPiece(&local_528,"/prefix/");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_528,(vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_6a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa0);
    poVar5 = LogMessage::stream(&local_6a8);
    std::operator<<(poVar5,"Check failed: (s.Match(\"/prefix/\", __null)) == (true)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_6a8);
  }
  StringPiece::StringPiece(&local_6b8,"/prefix/42");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_6b8,(vector<int,_std::allocator<int>_> *)0x0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)
               &v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa1);
    poVar5 = LogMessage::stream((LogMessage *)
                                &v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar5,"Check failed: (s.Match(\"/prefix/42\", __null)) == (true)");
    LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)
               &v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_850);
  StringPiece::StringPiece(&local_860,"/prefix");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_860,(vector<int,_std::allocator<int>_> *)local_850)
  ;
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_9e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa4);
    poVar5 = LogMessage::stream(&local_9e0);
    std::operator<<(poVar5,"Check failed: (s.Match(\"/prefix\", &v)) == (false)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_9e0);
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_850);
  if (sVar3 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_b60,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa5);
    poVar5 = LogMessage::stream(&local_b60);
    std::operator<<(poVar5,"Check failed: (v.size()) == (0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_b60);
  }
  StringPiece::StringPiece(&local_b70,"/prefix/");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_b70,(vector<int,_std::allocator<int>_> *)local_850)
  ;
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_cf0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa7);
    poVar5 = LogMessage::stream(&local_cf0);
    std::operator<<(poVar5,"Check failed: (s.Match(\"/prefix/\", &v)) == (true)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_cf0);
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_850);
  if (sVar3 != 1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_e70,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa8);
    poVar5 = LogMessage::stream(&local_e70);
    std::operator<<(poVar5,"Check failed: (v.size()) == (1)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_e70);
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_850,0);
  if (*pvVar4 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_ff0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xa9);
    poVar5 = LogMessage::stream(&local_ff0);
    std::operator<<(poVar5,"Check failed: (v[0]) == (0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_ff0);
  }
  StringPiece::StringPiece(&local_1000,"/prefix/42");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_1000,(vector<int,_std::allocator<int>_> *)local_850
                         );
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1180,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xab);
    poVar5 = LogMessage::stream(&local_1180);
    std::operator<<(poVar5,"Check failed: (s.Match(\"/prefix/42\", &v)) == (true)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1180);
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_850);
  if (sVar3 != 1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1300,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xac);
    poVar5 = LogMessage::stream(&local_1300);
    std::operator<<(poVar5,"Check failed: (v.size()) == (1)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1300);
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_850,0);
  if (*pvVar4 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1480,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0xad);
    poVar5 = LogMessage::stream(&local_1480);
    std::operator<<(poVar5,"Check failed: (v[0]) == (0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1480);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_850);
  RE2::Set::~Set((Set *)local_50);
  return;
}

Assistant:

TEST(Set, Prefix) {
  RE2::Set s(RE2::DefaultOptions, RE2::ANCHOR_BOTH);

  CHECK_EQ(s.Add("/prefix/\\d*", NULL), 0);
  CHECK_EQ(s.Compile(), true);

  CHECK_EQ(s.Match("/prefix", NULL), false);
  CHECK_EQ(s.Match("/prefix/", NULL), true);
  CHECK_EQ(s.Match("/prefix/42", NULL), true);

  vector<int> v;
  CHECK_EQ(s.Match("/prefix", &v), false);
  CHECK_EQ(v.size(), 0);

  CHECK_EQ(s.Match("/prefix/", &v), true);
  CHECK_EQ(v.size(), 1);
  CHECK_EQ(v[0], 0);

  CHECK_EQ(s.Match("/prefix/42", &v), true);
  CHECK_EQ(v.size(), 1);
  CHECK_EQ(v[0], 0);
}